

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void parse_constant_table
               (Context *ctx,uint32 *tokens,uint32 bytes,uint32 okay_version,int setvariables,
               CtabData *ctab)

{
  ulong uVar1;
  uint32 *start;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint32 pos;
  bool bVar5;
  long lVar6;
  int iVar7;
  MOJOSHADER_symbol *pMVar8;
  VariableList *pVVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  char *pcVar13;
  size_t sVar14;
  ulong uVar15;
  MOJOSHADER_uniformType MVar16;
  ulong uVar17;
  char cVar18;
  
  if (tokens[1] != 0x42415443) {
    return;
  }
  if (ctab->have_ctab == 0) {
    ctab->have_ctab = 1;
    if (bytes < 0x20) {
      pcVar13 = "Truncated CTAB data";
    }
    else {
      uVar3 = tokens[5];
      if ((uVar3 < 0xf4241 && tokens[2] == 0x1c) &&
         (uVar4 = tokens[6], uVar4 < bytes && (tokens[3] < bytes && tokens[4] == okay_version))) {
        uVar12 = tokens[8];
        if ((uVar12 < bytes && uVar3 * 0x14 <= bytes - uVar4) &&
           (uVar10 = bytes - uVar12, 0 < (int)uVar10)) {
          start = tokens + 2;
          if (*(uint8 *)((long)start + (ulong)uVar12) == '\0') {
LAB_00110a8a:
            ctab->symbols = (MOJOSHADER_symbol *)0x0;
            if (uVar3 != 0) {
              sVar14 = (ulong)uVar3 * 0x38;
              pMVar8 = (MOJOSHADER_symbol *)(*ctx->malloc)((int)sVar14,ctx->malloc_data);
              if (pMVar8 == (MOJOSHADER_symbol *)0x0) {
                ctx->isfail = 1;
                ctx->out_of_memory = 1;
                ctab->symbols = (MOJOSHADER_symbol *)0x0;
                return;
              }
              ctab->symbols = pMVar8;
              memset(pMVar8,0,sVar14);
            }
            ctab->symbol_count = uVar3;
            if (uVar3 != 0) {
              uVar17 = 0;
              do {
                uVar12 = *(uint *)((long)start + uVar17 * 0x14 + (ulong)uVar4);
                uVar11 = (ulong)uVar12;
                if ((uVar12 < bytes) && (uVar12 = bytes - uVar12, 0 < (int)uVar12)) {
                  bVar5 = true;
                  if (*(uint8 *)((long)start + uVar11) != '\0') {
                    uVar15 = 0;
                    do {
                      if ((ulong)uVar12 - 1 == uVar15) goto LAB_00110b4e;
                      uVar1 = uVar15 + 1;
                      lVar6 = uVar15 + uVar11 + 9;
                      uVar15 = uVar1;
                    } while (*(char *)((long)tokens + lVar6) != '\0');
                    if (uVar12 <= uVar1) goto LAB_00110b4e;
                  }
                }
                else {
LAB_00110b4e:
                  bVar5 = false;
                }
                cVar18 = '\x02';
                if (((bVar5) &&
                    (*(uint *)((long)start + uVar17 * 0x14 + (ulong)uVar4 + 0x10) < bytes)) &&
                   (uVar2 = *(ushort *)((long)start + uVar17 * 0x14 + (ulong)uVar4 + 4), uVar2 < 4))
                {
                  switch(uVar2) {
                  case 0:
                    MVar16 = MOJOSHADER_UNIFORM_BOOL;
                    break;
                  case 1:
                    MVar16 = MOJOSHADER_UNIFORM_INT;
                    break;
                  case 2:
                    MVar16 = MOJOSHADER_UNIFORM_FLOAT;
                    break;
                  case 3:
                    MVar16 = MOJOSHADER_UNIFORM_UNKNOWN;
                    bVar5 = false;
                    goto LAB_00110bb1;
                  }
                  bVar5 = true;
LAB_00110bb1:
                  pos = *(uint32 *)((long)start + uVar17 * 0x14 + (ulong)uVar4 + 0xc);
                  uVar10 = (uint)*(ushort *)((long)start + uVar17 * 0x14 + (ulong)uVar4 + 6);
                  uVar12 = (uint)*(ushort *)((long)start + uVar17 * 0x14 + (ulong)uVar4 + 8);
                  if (bVar5 && setvariables != 0) {
                    pVVar9 = (VariableList *)(*ctx->malloc)(0x28,ctx->malloc_data);
                    if (pVVar9 == (VariableList *)0x0) {
                      ctx->isfail = 1;
                      ctx->out_of_memory = 1;
                    }
                    else {
                      pVVar9->type = MVar16;
                      pVVar9->index = uVar10;
                      pVVar9->count = uVar12;
                      pVVar9->constant = (ConstantsList *)0x0;
                      pVVar9->used = 0;
                      pVVar9->emit_position = -1;
                      pVVar9->next = ctx->variables;
                      ctx->variables = pVVar9;
                    }
                  }
                  sVar14 = strlen((char *)(uVar11 + (long)start));
                  pcVar13 = (char *)(*ctx->malloc)((int)sVar14 + 1,ctx->malloc_data);
                  if (pcVar13 == (char *)0x0) {
                    ctx->isfail = 1;
                    ctx->out_of_memory = 1;
                    cVar18 = '\x01';
                  }
                  else {
                    strcpy(pcVar13,(char *)(uVar11 + (long)start));
                    pMVar8 = ctab->symbols + uVar17;
                    pMVar8->name = pcVar13;
                    pMVar8->register_set = (uint)uVar2;
                    pMVar8->register_index = uVar10;
                    pMVar8->register_count = uVar12;
                    iVar7 = parse_ctab_typeinfo(ctx,(uint8 *)start,bytes,pos,&pMVar8->info,0);
                    cVar18 = '\x02';
                    if (iVar7 != 0) {
                      cVar18 = ctx->out_of_memory != 0;
                    }
                  }
                }
                if (cVar18 != '\0') {
                  if (cVar18 != '\x02') {
                    return;
                  }
                  goto LAB_00110d0c;
                }
                uVar17 = uVar17 + 1;
              } while (uVar17 != uVar3);
            }
            return;
          }
          uVar17 = 0;
          do {
            if ((ulong)uVar10 - 1 == uVar17) goto LAB_00110d0c;
            uVar11 = uVar17 + 1;
            lVar6 = uVar17 + (ulong)uVar12 + 9;
            uVar17 = uVar11;
          } while (*(char *)((long)tokens + lVar6) != '\0');
          if (uVar11 < uVar10) goto LAB_00110a8a;
        }
      }
LAB_00110d0c:
      pcVar13 = "Shader has corrupt CTAB data";
    }
  }
  else {
    pcVar13 = "Shader has multiple CTAB sections";
  }
  failf(ctx,"%s",pcVar13);
  return;
}

Assistant:

static void parse_constant_table(Context *ctx, const uint32 *tokens,
                                 const uint32 bytes, const uint32 okay_version,
                                 const int setvariables, CtabData *ctab)
{
    const uint32 id = SWAP32(tokens[1]);
    if (id != CTAB_ID)
        return;  // not the constant table.

    if (ctab->have_ctab)  // !!! FIXME: can you have more than one?
    {
        fail(ctx, "Shader has multiple CTAB sections");
        return;
    } // if

    ctab->have_ctab = 1;

    const uint8 *start = (uint8 *) &tokens[2];

    if (bytes < 32)
    {
        fail(ctx, "Truncated CTAB data");
        return;
    } // if

    const uint32 size = SWAP32(tokens[2]);
    const uint32 creator = SWAP32(tokens[3]);
    const uint32 version = SWAP32(tokens[4]);
    const uint32 constants = SWAP32(tokens[5]);
    const uint32 constantinfo = SWAP32(tokens[6]);
    const uint32 target = SWAP32(tokens[8]);

    if (size != CTAB_SIZE)
        goto corrupt_ctab;
    else if (constants > 1000000)  // sanity check.
        goto corrupt_ctab;

    if (version != okay_version) goto corrupt_ctab;
    if (creator >= bytes) goto corrupt_ctab;
    if (constantinfo >= bytes) goto corrupt_ctab;
    if ((bytes - constantinfo) < (constants * CINFO_SIZE)) goto corrupt_ctab;
    if (target >= bytes) goto corrupt_ctab;
    if (!parse_ctab_string(start, bytes, target)) goto corrupt_ctab;
    // !!! FIXME: check that (start+target) points to "ps_3_0", etc.

    ctab->symbols = NULL;
    if (constants > 0)
    {
        ctab->symbols = (MOJOSHADER_symbol *) Malloc(ctx, sizeof (MOJOSHADER_symbol) * constants);
        if (ctab->symbols == NULL)
            return;
        memset(ctab->symbols, '\0', sizeof (MOJOSHADER_symbol) * constants);
    } // if
    ctab->symbol_count = constants;

    uint32 i = 0;
    for (i = 0; i < constants; i++)
    {
        const uint8 *ptr = start + constantinfo + (i * CINFO_SIZE);
        const uint32 name = SWAP32(*((uint32 *) (ptr + 0)));
        const uint16 regset = SWAP16(*((uint16 *) (ptr + 4)));
        const uint16 regidx = SWAP16(*((uint16 *) (ptr + 6)));
        const uint16 regcnt = SWAP16(*((uint16 *) (ptr + 8)));
        const uint32 typeinf = SWAP32(*((uint32 *) (ptr + 12)));
        const uint32 defval = SWAP32(*((uint32 *) (ptr + 16)));
        MOJOSHADER_uniformType mojotype = MOJOSHADER_UNIFORM_UNKNOWN;

        if (!parse_ctab_string(start, bytes, name)) goto corrupt_ctab;
        if (defval >= bytes) goto corrupt_ctab;

        switch (regset)
        {
            case 0: mojotype = MOJOSHADER_UNIFORM_BOOL; break;
            case 1: mojotype = MOJOSHADER_UNIFORM_INT; break;
            case 2: mojotype = MOJOSHADER_UNIFORM_FLOAT; break;
            case 3: /* SAMPLER */ break;
            default: goto corrupt_ctab;
        } // switch

        if ((setvariables) && (mojotype != MOJOSHADER_UNIFORM_UNKNOWN))
        {
            VariableList *item;
            item = (VariableList *) Malloc(ctx, sizeof (VariableList));
            if (item != NULL)
            {
                item->type = mojotype;
                item->index = regidx;
                item->count = regcnt;
                item->constant = NULL;
                item->used = 0;
                item->emit_position = -1;
                item->next = ctx->variables;
                ctx->variables = item;
            } // if
        } // if

        // Add the symbol.
        const char *namecpy = StrDup(ctx, (const char *) (start + name));
        if (namecpy == NULL)
            return;

        MOJOSHADER_symbol *sym = &ctab->symbols[i];
        sym->name = namecpy;
        sym->register_set = (MOJOSHADER_symbolRegisterSet) regset;
        sym->register_index = (unsigned int) regidx;
        sym->register_count = (unsigned int) regcnt;
        if (!parse_ctab_typeinfo(ctx, start, bytes, typeinf, &sym->info, 0))
            goto corrupt_ctab;  // sym->name will get free()'d later.
        else if (ctx->out_of_memory)
            return;  // just bail now.
    } // for

    return;

corrupt_ctab:
    fail(ctx, "Shader has corrupt CTAB data");
}